

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new(lyd_node *parent,lys_module *module,char *name)

{
  LYS_NODE LVar1;
  int iVar2;
  size_t sVar3;
  lyd_node *plVar4;
  LY_ERR *pLVar5;
  lys_node *siblings;
  lys_node **pplVar6;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0)
  goto LAB_0015aea6;
  if (parent == (lyd_node *)0x0) {
    pplVar6 = &module->data;
LAB_0015ae59:
    siblings = *pplVar6;
    if (siblings == (lys_node *)0x0) goto LAB_0015aea6;
  }
  else {
    if ((parent->schema == (lys_node *)0x0) ||
       (siblings = parent->schema->child, siblings == (lys_node *)0x0)) goto LAB_0015aea6;
    LVar1 = siblings->nodetype;
    if (LVar1 == LYS_OUTPUT) {
      siblings = siblings->next;
      if (siblings == (lys_node *)0x0) goto LAB_0015aea6;
      LVar1 = siblings->nodetype;
    }
    if (LVar1 == LYS_INPUT) {
      pplVar6 = &siblings->child;
      goto LAB_0015ae59;
    }
  }
  sVar3 = strlen(name);
  iVar2 = lys_get_data_sibling
                    (module,siblings,name,(int)sVar3,
                     LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER,&local_38);
  if (iVar2 == 0 && local_38 != (lys_node *)0x0) {
    plVar4 = _lyd_new(parent,local_38,0);
    return plVar4;
  }
LAB_0015aea6:
  pLVar5 = ly_errno_location();
  *pLVar5 = LY_EINVAL;
  return (lyd_node *)0x0;
}

Assistant:

struct lyd_node *
_lyd_new(struct lyd_node *parent, const struct lys_node *schema, int dflt)
{
    struct lyd_node *ret;

    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        return NULL;
    }
    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = ret;
    ret->dflt = dflt;
    if (parent) {
        if (lyd_insert(parent, ret)) {
            lyd_free(ret);
            return NULL;
        }
    }
    return ret;
}